

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O3

void start_pass_2_quant(j_decompress_ptr cinfo,boolean is_pre_scan)

{
  jpeg_color_quantizer *pjVar1;
  _func_void_j_decompress_ptr *p_Var2;
  size_t bytestozero;
  code *pcVar3;
  _func_void_j_decompress_ptr_boolean *target;
  undefined4 uVar4;
  long lVar5;
  undefined8 uVar6;
  
  pjVar1 = cinfo->cquantize;
  p_Var2 = pjVar1[1].finish_pass;
  if (cinfo->dither_mode == JDITHER_NONE) {
    if (is_pre_scan != 0) goto LAB_0011358d;
    pcVar3 = pass2_no_dither;
LAB_001135ea:
    pjVar1->color_quantize = pcVar3;
    pjVar1->finish_pass = finish_pass2;
    if (cinfo->actual_number_of_colors < 1) {
      uVar6 = 0x100000038;
LAB_0011361c:
      *(undefined8 *)&cinfo->err->msg_code = uVar6;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    else if (0x100 < (uint)cinfo->actual_number_of_colors) {
      uVar6 = 0x10000000039;
      goto LAB_0011361c;
    }
    if (cinfo->dither_mode != JDITHER_FS) goto LAB_001135b2;
    bytestozero = (ulong)(cinfo->output_width + 2) * 6;
    target = pjVar1[2].start_pass;
    if (target == (_func_void_j_decompress_ptr_boolean *)0x0) {
      target = (_func_void_j_decompress_ptr_boolean *)
               (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,bytestozero);
      pjVar1[2].start_pass = target;
    }
    jzero_far(target,bytestozero);
    uVar4 = 0;
    lVar5 = 0x48;
    if (pjVar1[2].finish_pass == (_func_void_j_decompress_ptr *)0x0) {
      init_error_limit(cinfo);
    }
  }
  else {
    cinfo->dither_mode = JDITHER_FS;
    if (is_pre_scan == 0) {
      pcVar3 = pass2_fs_dither;
      goto LAB_001135ea;
    }
LAB_0011358d:
    pjVar1->color_quantize = prescan_quantize;
    pjVar1->finish_pass = finish_pass1;
    uVar4 = 1;
    lVar5 = 0x38;
  }
  *(undefined4 *)((long)&pjVar1->start_pass + lVar5) = uVar4;
LAB_001135b2:
  if (*(int *)&pjVar1[1].new_color_map != 0) {
    lVar5 = 0;
    do {
      jzero_far(*(void **)(p_Var2 + lVar5 * 8),0x1000);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x20);
    *(undefined4 *)&pjVar1[1].new_color_map = 0;
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass_2_quant(j_decompress_ptr cinfo, boolean is_pre_scan)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  int i;

  /* Only F-S dithering or no dithering is supported. */
  /* If user asks for ordered dither, give them F-S. */
  if (cinfo->dither_mode != JDITHER_NONE)
    cinfo->dither_mode = JDITHER_FS;

  if (is_pre_scan) {
    /* Set up method pointers */
    cquantize->pub.color_quantize = prescan_quantize;
    cquantize->pub.finish_pass = finish_pass1;
    cquantize->needs_zeroed = TRUE; /* Always zero histogram */
  } else {
    /* Set up method pointers */
    if (cinfo->dither_mode == JDITHER_FS)
      cquantize->pub.color_quantize = pass2_fs_dither;
    else
      cquantize->pub.color_quantize = pass2_no_dither;
    cquantize->pub.finish_pass = finish_pass2;

    /* Make sure color count is acceptable */
    i = cinfo->actual_number_of_colors;
    if (i < 1)
      ERREXIT1(cinfo, JERR_QUANT_FEW_COLORS, 1);
    if (i > MAXNUMCOLORS)
      ERREXIT1(cinfo, JERR_QUANT_MANY_COLORS, MAXNUMCOLORS);

    if (cinfo->dither_mode == JDITHER_FS) {
      size_t arraysize =
        (size_t)((cinfo->output_width + 2) * (3 * sizeof(FSERROR)));
      /* Allocate Floyd-Steinberg workspace if we didn't already. */
      if (cquantize->fserrors == NULL)
        cquantize->fserrors = (FSERRPTR)(*cinfo->mem->alloc_large)
          ((j_common_ptr)cinfo, JPOOL_IMAGE, arraysize);
      /* Initialize the propagated errors to zero. */
      jzero_far((void *)cquantize->fserrors, arraysize);
      /* Make the error-limit table if we didn't already. */
      if (cquantize->error_limiter == NULL)
        init_error_limit(cinfo);
      cquantize->on_odd_row = FALSE;
    }

  }
  /* Zero the histogram or inverse color map, if necessary */
  if (cquantize->needs_zeroed) {
    for (i = 0; i < HIST_C0_ELEMS; i++) {
      jzero_far((void *)histogram[i],
                HIST_C1_ELEMS * HIST_C2_ELEMS * sizeof(histcell));
    }
    cquantize->needs_zeroed = FALSE;
  }
}